

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O2

char * sha1_Data(sha2_byte *data,size_t len,char *digest)

{
  char *pcVar1;
  SHA1_CTX context;
  SHA1_CTX local_80;
  
  sha1_Init(&local_80);
  sha1_Update(&local_80,data,len);
  pcVar1 = sha1_End(&local_80,digest);
  return pcVar1;
}

Assistant:

char* sha1_Data(const sha2_byte* data, size_t len, char digest[SHA1_DIGEST_STRING_LENGTH]) {
    trezor::SHA1_CTX	context;

	sha1_Init(&context);
	sha1_Update(&context, data, len);
	return sha1_End(&context, digest);
}